

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlChar * xmlSchemaStrip(xmlChar *value)

{
  byte *pbVar1;
  xmlChar *pxVar2;
  long lVar3;
  byte *pbVar4;
  int len;
  xmlChar *start;
  byte *cur;
  ulong uVar5;
  long lVar6;
  
  if (value != (xmlChar *)0x0) {
    lVar3 = 0;
    while ((uVar5 = (ulong)value[lVar3], uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)
           )) {
      lVar3 = lVar3 + 1;
    }
    cur = value + lVar3;
    len = 0;
    pbVar4 = cur;
    while ((char)uVar5 != '\0') {
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      len = len + 1;
      uVar5 = (ulong)*pbVar1;
    }
    lVar6 = -1;
    while (((cur < pbVar4 + lVar6 && (uVar5 = (ulong)pbVar4[lVar6], uVar5 < 0x21)) &&
           ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
      lVar6 = lVar6 + -1;
      len = len + -1;
    }
    if (lVar3 != 0 || lVar6 != -1) {
      pxVar2 = xmlStrndup(cur,len);
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlSchemaStrip(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) end++;
    f = end;
    end--;
    while ((end > start) && (IS_BLANK_CH(*end))) end--;
    end++;
    if ((start == value) && (f == end)) return(NULL);
    return(xmlStrndup(start, end - start));
}